

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

void __thiscall Kuhn::Game::reset(Game *this,bool skipChanceAction)

{
  int iVar1;
  result_type_conflict1 rVar2;
  int iVar3;
  int iVar4;
  undefined3 in_register_00000031;
  ulong uVar5;
  
  if (CONCAT31(in_register_00000031,skipChanceAction) == 0) {
    this->mCurrentPlayer = 3;
  }
  else {
    (this->mCards)._M_elems[0] = 0;
    (this->mCards)._M_elems[1] = 1;
    (this->mCards)._M_elems[2] = 2;
    uVar5 = 4;
    iVar4 = 3;
    do {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this->mEngine);
      iVar1 = (this->mCards)._M_elems[uVar5 - 2];
      iVar3 = (int)((long)((ulong)(uint)((int)rVar2 >> 0x1f) << 0x20 | rVar2 & 0xffffffff) %
                   (long)iVar4);
      (this->mCards)._M_elems[uVar5 - 2] = (this->mCards)._M_elems[iVar3];
      (this->mCards)._M_elems[iVar3] = iVar1;
      uVar5 = uVar5 - 1;
      iVar4 = iVar4 + -1;
    } while (2 < uVar5);
    iVar4 = (this->mCards)._M_elems[1];
    this->mInfoSets[0][0] = (uint8_t)(this->mCards)._M_elems[0];
    this->mInfoSets[1][0] = (uint8_t)iVar4;
    this->mTurnNum = 0;
    this->mCurrentPlayer = 0;
    this->mFirstBetTurn = -1;
    this->mBetPlayerNum = 0;
    this->mDone = false;
  }
  return;
}

Assistant:

void Game::reset(bool skipChanceAction) {
    if (!skipChanceAction) {
        mCurrentPlayer = PlayerNum + 1;
        return;
    }

    for (int i = 0; i < CardNum; ++i) {
        mCards[i] = i;
    }
    // shuffle cards
    for (int c1 = int(mCards.size()) - 1; c1 > 0; --c1) {
        const int c2 = int(mEngine()) % (c1 + 1);
        const int tmp = mCards[c1];
        mCards[c1] = mCards[c2];
        mCards[c2] = tmp;
    }
    for (int i = 0; i < PlayerNum; ++i) {
        mInfoSets[i][0] = mCards[i];
    }
    mTurnNum = 0;
    mCurrentPlayer = 0;
    mFirstBetTurn = -1;
    mBetPlayerNum = 0;
    mDone = false;
}